

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fMultisampleTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::CommonEdgeCase::CommonEdgeCase
          (CommonEdgeCase *this,Context *context,char *name,char *description,CaseType caseType)

{
  int iVar1;
  int iVar2;
  
  MultisampleCase::MultisampleCase(&this->super_MultisampleCase,context,name,description);
  (this->super_MultisampleCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__MultisampleCase_00776d68;
  this->m_caseType = caseType;
  if (caseType == CASETYPE_BIGGER_THAN_VIEWPORT_QUAD) {
    iVar1 = tcu::CommandLine::getTestIterationCount
                      (((this->super_MultisampleCase).super_TestCase.super_TestCase.super_TestNode.
                       m_testCtx)->m_cmdLine);
    iVar2 = 0x40;
  }
  else {
    iVar2 = 8;
    if (caseType != CASETYPE_SMALL_QUADS) goto LAB_003707b4;
    iVar1 = tcu::CommandLine::getTestIterationCount
                      (((this->super_MultisampleCase).super_TestCase.super_TestCase.super_TestNode.
                       m_testCtx)->m_cmdLine);
    iVar2 = 0x10;
  }
  if (0 < iVar1) {
    iVar2 = iVar1;
  }
LAB_003707b4:
  this->m_numIterations = iVar2;
  this->m_currentIteration = 0;
  return;
}

Assistant:

CommonEdgeCase::CommonEdgeCase (Context& context, const char* name, const char* description, CaseType caseType)
	: MultisampleCase		(context, name, description)
	, m_caseType			(caseType)
	, m_numIterations		(caseType == CASETYPE_SMALL_QUADS					? getIterationCount(m_testCtx, DEFAULT_SMALL_QUADS_ITERATIONS)
							: caseType == CASETYPE_BIGGER_THAN_VIEWPORT_QUAD	? getIterationCount(m_testCtx, DEFAULT_BIGGER_THAN_VIEWPORT_QUAD_ITERATIONS)
							: 8)
	, m_currentIteration	(0)
{
}